

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O0

void __thiscall CompoundFile::Stream::seekToNextSector(Stream *this)

{
  long lVar1;
  int32_t iVar2;
  int32_t iVar3;
  size_t sVar4;
  reference pvVar5;
  reference pvVar6;
  streamoff sVar7;
  long in_RDI;
  streampos pos;
  int32_t offset;
  SecID largeSector;
  size_type in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SecID *in_stack_ffffffffffffffb0;
  char *pcVar8;
  SecID *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  fpos local_20 [16];
  int32_t local_10;
  SecID local_c [3];
  
  if (*(int *)(in_RDI + 0x50) == 0) {
    *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + 1;
    lVar1 = *(long *)(in_RDI + 0x48);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
              ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    sVar4 = calcFileOffset((SecID *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
    std::istream::seekg(lVar1,(_Ios_Seekdir)sVar4);
    pvVar5 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                       ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    *(int32_t *)(in_RDI + 0x8c) = pvVar5->m_id;
    pcVar8 = *(char **)(in_RDI + 0x48);
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x70),0);
    std::istream::read(pcVar8,(long)pvVar6);
    *(undefined4 *)(in_RDI + 0x88) = 0;
  }
  else {
    *(int *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) + 1;
    SecID::SecID(local_c);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
              ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98);
    local_10 = whereIsShortSector((Stream *)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    iVar2 = SecID::operator_cast_to_int((SecID *)(in_RDI + 0x8c));
    iVar3 = SecID::operator_cast_to_int(local_c);
    if (iVar2 != iVar3) {
      *(int32_t *)(in_RDI + 0x8c) = local_c[0].m_id;
      Header::sectorSize(*(Header **)(in_RDI + 0x10));
      calcFileOffset((SecID *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      lVar1 = *(long *)(in_RDI + 0x48);
      sVar7 = std::fpos::operator_cast_to_long(local_20);
      std::istream::seekg(lVar1,(_Ios_Seekdir)sVar7);
      pcVar8 = *(char **)(in_RDI + 0x48);
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x70),0);
      Header::sectorSize(*(Header **)(in_RDI + 0x10));
      std::istream::read(pcVar8,(long)pvVar6);
    }
    iVar2 = Header::shortSectorSize(*(Header **)(in_RDI + 0x10));
    *(int32_t *)(in_RDI + 0x88) = local_10 * iVar2;
  }
  return;
}

Assistant:

inline void
Stream::seekToNextSector()
{
	if( m_mode == LargeStream )
	{
		++m_largeSecIDIdx;

		m_stream.seekg( calcFileOffset( m_largeStreamChain.at( m_largeSecIDIdx ),
			m_sectorSize ), std::ios::beg );

		m_currentLargeSectorID = m_largeStreamChain.at( m_largeSecIDIdx );

		m_stream.read( &m_buf[ 0 ], m_sectorSize );

		m_pos = 0;
	}
	else
	{
		++m_shortSecIDIdx;

		SecID largeSector;
		const int32_t offset =
			whereIsShortSector( m_shortStreamChain.at( m_shortSecIDIdx ),
				largeSector );

		if( m_currentLargeSectorID != largeSector )
		{
			m_currentLargeSectorID = largeSector;

			std::streampos pos = calcFileOffset( largeSector,
				m_header.sectorSize() );

			m_stream.seekg( pos, std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_header.sectorSize() );
		}

		m_pos = offset * m_header.shortSectorSize();
	}
}